

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_flush_page_by_mmuidx_all_cpus_synced_arm
               (CPUState *src_cpu,target_ulong_conflict addr,uint16_t idxmap)

{
  uint uVar1;
  uint *mem;
  uint uVar2;
  undefined6 in_register_00000012;
  
  uVar2 = (uint)CONCAT62(in_register_00000012,idxmap);
  uVar1 = src_cpu->uc->init_target_page->mask;
  if (SBORROW4(uVar2,-uVar1) != (int)(uVar2 + uVar1) < 0) {
    tlb_flush_page_by_mmuidx_async_0(src_cpu,(uVar2 | addr) & uVar1,idxmap & ~(ushort)uVar1);
    return;
  }
  mem = (uint *)g_malloc(8);
  *mem = uVar1 & addr;
  *(uint16_t *)(mem + 1) = idxmap;
  tlb_flush_page_by_mmuidx_async_0(src_cpu,uVar1 & addr,idxmap);
  g_free(mem);
  return;
}

Assistant:

void tlb_flush_page_by_mmuidx_all_cpus_synced(CPUState *src_cpu,
                                              target_ulong addr,
                                              uint16_t idxmap)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = src_cpu->uc;
#endif

    /* This should already be page aligned */
    addr &= TARGET_PAGE_MASK;

    /*
     * Allocate memory to hold addr+idxmap only when needed.
     * See tlb_flush_page_by_mmuidx for details.
     */
    if (idxmap < TARGET_PAGE_SIZE) {
        flush_all_helper(src_cpu, tlb_flush_page_by_mmuidx_async_1,
                         RUN_ON_CPU_TARGET_PTR(addr | idxmap));
        tlb_flush_page_by_mmuidx_async_1(src_cpu, RUN_ON_CPU_TARGET_PTR(addr | idxmap));
    } else {
        //CPUState *dst_cpu;
        TLBFlushPageByMMUIdxData *d;

#if 0
        /* Allocate a separate data block for each destination cpu.  */
        CPU_FOREACH(dst_cpu) {
            if (dst_cpu != src_cpu) {
                d = g_new(TLBFlushPageByMMUIdxData, 1);
                d->addr = addr;
                d->idxmap = idxmap;
                tlb_flush_page_by_mmuidx_async_2(dst_cpu, RUN_ON_CPU_HOST_PTR(d));
            }
        }
#endif

        d = g_new(TLBFlushPageByMMUIdxData, 1);
        d->addr = addr;
        d->idxmap = idxmap;
        tlb_flush_page_by_mmuidx_async_2(src_cpu, RUN_ON_CPU_HOST_PTR(d));
    }
}